

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void RAWToARGBRow_C(uint8 *src_raw,uint8 *dst_argb,int width)

{
  uint8 uVar1;
  uint8 uVar2;
  int local_20;
  uint8 b;
  uint8 g;
  uint8 r;
  int x;
  int width_local;
  uint8 *dst_argb_local;
  uint8 *src_raw_local;
  
  _x = dst_argb;
  dst_argb_local = src_raw;
  for (local_20 = 0; local_20 < width; local_20 = local_20 + 1) {
    uVar1 = *dst_argb_local;
    uVar2 = dst_argb_local[1];
    *_x = dst_argb_local[2];
    _x[1] = uVar2;
    _x[2] = uVar1;
    _x[3] = 0xff;
    _x = _x + 4;
    dst_argb_local = dst_argb_local + 3;
  }
  return;
}

Assistant:

void RAWToARGBRow_C(const uint8* src_raw, uint8* dst_argb, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8 r = src_raw[0];
    uint8 g = src_raw[1];
    uint8 b = src_raw[2];
    dst_argb[0] = b;
    dst_argb[1] = g;
    dst_argb[2] = r;
    dst_argb[3] = 255u;
    dst_argb += 4;
    src_raw += 3;
  }
}